

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

void nn_sws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *piVar1;
  void **ppvVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  byte bVar6;
  uint16_t uVar7;
  int iVar8;
  uint uVar9;
  nn_fsm *pnVar10;
  nn_fsm *extraout_RAX;
  nn_ctx *pnVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  void *pvVar17;
  long lVar18;
  int opt;
  size_t opt_sz;
  int local_1c;
  size_t local_18;
  
  local_18 = 4;
  iVar8 = 0x1b7d6c;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src != -2) {
LAB_001aab16:
      nn_sws_handler_cold_23();
LAB_001aab1b:
      nn_sws_handler_cold_7();
LAB_001aab20:
      nn_sws_handler_cold_21();
      goto LAB_001aab25;
    }
    if (type == -2) {
      nn_ws_handshake_start
                ((nn_ws_handshake *)&self[1].srcptr,*(nn_usock **)&self[1].state,
                 (nn_pipebase *)&self[0x3d].stopped.srcptr,*(int *)&self[1].shutdown_fn,
                 *(char **)&self[0x40].state,(char *)self[0x40].srcptr);
      *(undefined4 *)&self[1].fn = 2;
      return;
    }
    goto LAB_001aab31;
  case 2:
    if (src != 2) goto LAB_001aab20;
    if (type == 2) goto LAB_001aa52a;
    if (type == 1) {
      nn_ws_handshake_stop((nn_ws_handshake *)&self[1].srcptr);
      *(undefined4 *)&self[1].fn = 3;
      return;
    }
    goto LAB_001aab42;
  case 3:
    if (src != 2) {
LAB_001aab11:
      nn_sws_handler_cold_19();
      goto LAB_001aab16;
    }
    if (type == 3) {
      iVar8 = nn_pipebase_start((nn_pipebase *)&self[0x3d].stopped.srcptr);
      if (-1 < iVar8) {
        nn_sws_recv_hdr((nn_sws *)self);
        *(undefined4 *)&self[0x44].stopped.srcptr = 1;
        *(undefined4 *)&self[1].fn = 4;
        return;
      }
LAB_001aa54e:
      *(undefined4 *)&self[1].fn = 7;
      iVar8 = 1;
      goto LAB_001aa564;
    }
    break;
  case 4:
    if (src != 1) goto LAB_001aab1b;
    switch(type) {
    case 3:
      if (*(int *)&self[0x44].stopped.srcptr == 2) {
        *(undefined4 *)&self[0x44].stopped.srcptr = 1;
        nn_msg_term((nn_msg *)(self + 0x45));
        nn_msg_init((nn_msg *)(self + 0x45),0);
        nn_pipebase_sent((nn_pipebase *)&self[0x3d].stopped.srcptr);
        return;
      }
      nn_sws_handler_cold_17();
LAB_001aab07:
      nn_sws_handler_cold_9();
      goto LAB_001aab0c;
    case 4:
      iVar8 = *(int *)&self[0x40].owner;
      if (iVar8 == 3) {
        if ((*(char *)((long)&self[0x40].stopped.fsm + 4) != '\0') &&
           (pnVar10 = self[0x41].stopped.fsm, pnVar10 != (nn_fsm *)0x0)) {
          lVar18 = *(long *)&self[0x40].stopped.src;
          pnVar11 = self[0x41].ctx;
          uVar14 = 0;
          do {
            pbVar3 = (byte *)((pnVar11->sync).mutex.__size + uVar14);
            *pbVar3 = *pbVar3 ^ *(byte *)(lVar18 + (ulong)((uint)uVar14 & 3));
            uVar14 = uVar14 + 1;
          } while ((nn_fsm *)(uVar14 & 0xffffffff) < pnVar10);
        }
        switch(*(undefined1 *)((long)&self[0x40].stopped.fsm + 2)) {
        case 0:
          if (((ulong)self[0x41].stopped.srcptr & 0xf00000000) == 0x100000000)
          goto switchD_001aa640_caseD_1;
        case 2:
          if (self[0x40].stopped.type == 0) {
LAB_001aa9cf:
            nn_sws_recv_hdr((nn_sws *)self);
            return;
          }
LAB_001aa733:
          *(undefined4 *)&self[0x40].owner = 4;
LAB_001aa827:
          nn_pipebase_received((nn_pipebase *)&self[0x3d].stopped.srcptr);
          return;
        case 1:
switchD_001aa640_caseD_1:
          nn_sws_validate_utf8_chunk((nn_sws *)self);
          return;
        case 8:
          goto switchD_001aa640_caseD_8;
        case 9:
        case 10:
switchD_001aa640_caseD_9:
          *(undefined4 *)&self[0x40].owner = 5;
          goto LAB_001aa827;
        }
        goto switchD_001aa640_caseD_3;
      }
      if (iVar8 == 2) {
        if (self[0x40].stopped.srcptr == (void *)0x0) goto LAB_001aab07;
        bVar4 = *(byte *)((long)&self[0x40].stopped.fsm + 3);
        pnVar10 = (nn_fsm *)(ulong)bVar4;
        if (pnVar10 < (nn_fsm *)0x7e) {
          lVar18 = 0x1626;
        }
        else if (pnVar10 == (nn_fsm *)0x7f) {
          pnVar10 = (nn_fsm *)nn_getll((uint8_t *)((long)&self[0x40].owner + 6));
          lVar18 = 0x162e;
        }
        else {
          if (bVar4 != 0x7e) {
            pcVar13 = "Invalid payload length.";
            goto LAB_001aa844;
          }
          uVar7 = nn_gets((uint8_t *)((long)&self[0x40].owner + 6));
          pnVar10 = (nn_fsm *)(ulong)uVar7;
          lVar18 = 0x1628;
        }
        self[0x41].stopped.fsm = pnVar10;
        lVar12 = 0;
        if (*(char *)((long)&self[0x40].stopped.fsm + 4) != '\0') {
          lVar12 = (long)&self->fn + lVar18;
        }
        *(long *)&self[0x40].stopped.src = lVar12;
        if (pnVar10 == (nn_fsm *)0x0) {
          if (self[0x40].stopped.type == 0) goto LAB_001aa9cf;
          if (*(char *)((long)&self[0x40].stopped.fsm + 2) == '\b') goto switchD_001aa640_caseD_8;
          *(uint *)&self[0x40].owner = 5 - (uint)(*(int *)&self[0x40].stopped.field_0x1c == 0);
          goto LAB_001aa827;
        }
        if (*(int *)&self[0x40].stopped.field_0x1c == 0) {
          piVar1 = &self[0x41].stopped.src;
          *(long *)piVar1 = (long)&pnVar10->fn + *(long *)piVar1;
          nn_pipebase_getopt((nn_pipebase *)&self[0x3d].stopped.srcptr,0,0x10,&local_1c,&local_18);
          if ((-1 < (long)local_1c) && ((ulong)(long)local_1c < *(ulong *)&self[0x41].stopped.src))
          {
            pcVar13 = "Message size exceeds limit.";
            goto LAB_001aa7f7;
          }
LAB_001aaabe:
          ppvVar2 = &self[0x41].stopped.srcptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
          pnVar11 = (nn_ctx *)
                    nn_msg_chunk_new((size_t)self[0x41].stopped.fsm,(nn_list *)&self[0x41].srcptr);
          goto LAB_001aaada;
        }
LAB_001aa77f:
        pnVar11 = (nn_ctx *)((long)&self[0x41].stopped.srcptr + 5);
LAB_001aaada:
        self[0x41].ctx = pnVar11;
        *(undefined4 *)&self[0x40].owner = 3;
        nn_usock_recv(*(nn_usock **)&self[1].state,pnVar11,(size_t)self[0x41].stopped.fsm,(int *)0x0
                     );
        return;
      }
      if (iVar8 != 1) goto LAB_001aab6b;
      bVar4 = *(byte *)((long)&self[0x40].owner + 4);
      if ((bVar4 & 0x70) != 0) {
        pcVar13 = "RSV1, RSV2, and RSV3 must be unset.";
        goto LAB_001aa844;
      }
      self[0x40].stopped.type = bVar4 & 0xffffff80;
      bVar6 = *(byte *)((long)&self[0x40].owner + 5);
      bVar15 = bVar6 & 0x80;
      *(byte *)((long)&self[0x40].stopped.fsm + 4) = bVar15;
      iVar8 = *(int *)&self[1].shutdown_fn;
      if (iVar8 == 1) {
        if (bVar15 != 0) {
          pcVar13 = "Client expects MASK bit to be unset.";
          goto LAB_001aa844;
        }
        pvVar17 = (void *)0x0;
LAB_001aa6d0:
        self[0x40].stopped.srcptr = pvVar17;
        uVar16 = bVar4 & 0xf;
        *(char *)((long)&self[0x40].stopped.fsm + 2) = (char)uVar16;
        uVar9 = bVar6 & 0x7f;
        pnVar10 = (nn_fsm *)(ulong)uVar9;
        bVar6 = (byte)uVar9;
        *(byte *)((long)&self[0x40].stopped.fsm + 3) = bVar6;
        iVar5 = *(int *)&self[0x40].stopped.item.next;
        if ((bVar4 & 0xf) == 0 && iVar5 == 0) {
          pcVar13 = "No message to continue.";
          goto LAB_001aa844;
        }
        if (iVar5 == 0) {
          *(byte *)((long)&self[0x41].stopped.srcptr + 4) = bVar4 | 0x80;
        }
        if (0x7d < bVar6) {
          lVar18 = 2;
          if (bVar6 != 0x7e) {
            if (uVar9 != 0x7f) goto LAB_001aab7a;
            lVar18 = 8;
          }
          ppvVar2 = &self[0x40].stopped.srcptr;
          *ppvVar2 = (void *)((long)*ppvVar2 + lVar18);
        }
        switch(uVar16) {
        case 0:
          *(undefined4 *)&self[0x40].stopped.field_0x1c = 0;
          *(uint *)&self[0x40].stopped.item.next = bVar4 >> 7 ^ 1;
          if ((self[0x40].stopped.srcptr != (void *)0x0) || (bVar6 != 0)) goto LAB_001aaa1f;
          if (iVar8 == 1) {
            self[0x41].stopped.fsm = (nn_fsm *)0x0;
            if (-1 < (char)bVar4) goto LAB_001aa9cf;
            goto LAB_001aa733;
          }
          goto LAB_001aab50;
        case 1:
        case 2:
          *(undefined4 *)&self[0x40].stopped.field_0x1c = 0;
          if (iVar5 != 0) {
            pcVar13 = "Expected continuation frame opcode.";
            goto LAB_001aa844;
          }
          if ((bVar4 & 0x80) == 0) {
            *(undefined4 *)&self[0x40].stopped.item.next = 1;
          }
          if ((self[0x40].stopped.srcptr != (void *)0x0) || (bVar6 != 0)) goto LAB_001aaa1f;
          if (iVar8 == 1) {
            self[0x41].stopped.fsm = (nn_fsm *)0x0;
            if (*(int *)&self[0x40].stopped.item.next != 0) goto LAB_001aa9cf;
            goto LAB_001aa733;
          }
          goto LAB_001aab66;
        default:
          pcVar13 = "Invalid opcode.";
          goto LAB_001aa844;
        case 8:
          *(undefined4 *)&self[0x40].stopped.field_0x1c = 1;
          if ((bVar4 & 0x80) == 0) goto LAB_001aa986;
          if (bVar6 < 0x7e) {
            if (bVar6 == 1) {
              pcVar13 = "Expected 2byte close code.";
              goto LAB_001aa844;
            }
            goto LAB_001aaa01;
          }
          goto LAB_001aa976;
        case 9:
          *(undefined4 *)&self[0x40].stopped.field_0x1c = 1;
          self[0x41].state = self[0x41].state + 1;
          break;
        case 10:
          *(undefined4 *)&self[0x40].stopped.field_0x1c = 1;
          self[0x41].src = self[0x41].src + 1;
        }
        if (0x7d < bVar6) {
LAB_001aa976:
          pcVar13 = "Control frame payload exceeds allowable length.";
LAB_001aa844:
          nn_sws_fail_conn((nn_sws *)self,0x3ea,pcVar13);
          return;
        }
        if ((bVar4 & 0x80) == 0) {
LAB_001aa986:
          pcVar13 = "Cannot fragment control message (FIN=0).";
          goto LAB_001aa844;
        }
        if ((bVar6 == 0) && (self[0x40].stopped.srcptr == (void *)0x0)) {
          self[0x41].stopped.fsm = (nn_fsm *)0x0;
          goto switchD_001aa640_caseD_9;
        }
LAB_001aaa1f:
        pvVar17 = self[0x40].stopped.srcptr;
        if (pvVar17 != (void *)0x0) {
          *(undefined4 *)&self[0x40].owner = 2;
          nn_usock_recv(*(nn_usock **)&self[1].state,(void *)((long)&self[0x40].owner + 6),
                        (size_t)pvVar17,(int *)0x0);
          return;
        }
        if (iVar8 != 1) goto LAB_001aab55;
        if (0x82 < (byte)((char)pnVar10 + 0x82U)) {
          self[0x41].stopped.fsm = pnVar10;
          if (*(int *)&self[0x40].stopped.field_0x1c == 0) {
            piVar1 = &self[0x41].stopped.src;
            *(long *)piVar1 = (long)&pnVar10->fn + *(long *)piVar1;
            nn_pipebase_getopt((nn_pipebase *)&self[0x3d].stopped.srcptr,0,0x10,&local_1c,&local_18)
            ;
            if ((-1 < (long)local_1c) && ((ulong)(long)local_1c < *(ulong *)&self[0x41].stopped.src)
               ) {
              pcVar13 = "Message larger than application allows.";
LAB_001aa7f7:
              nn_sws_fail_conn((nn_sws *)self,0x3f1,pcVar13);
              return;
            }
            goto LAB_001aaabe;
          }
          goto LAB_001aa77f;
        }
        goto LAB_001aab5a;
      }
      if (iVar8 == 2) {
        pvVar17 = (void *)0x4;
        if (bVar15 == 0) {
          pcVar13 = "Server expects MASK bit to be set.";
          goto LAB_001aa844;
        }
        goto LAB_001aa6d0;
      }
      break;
    case 5:
      nn_pipebase_stop((nn_pipebase *)&self[0x3d].stopped.srcptr);
      goto LAB_001aa54e;
    default:
      goto switchD_001aa4a4_caseD_6;
    case 8:
      nn_pipebase_stop((nn_pipebase *)&self[0x3d].stopped.srcptr);
      *(undefined4 *)&self[1].fn = 6;
      return;
    }
    goto LAB_001aab70;
  case 5:
    if (src != 1) {
LAB_001aab0c:
      nn_sws_handler_cold_4();
      goto LAB_001aab11;
    }
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_001aa54e;
    if (type == 3) {
      if (*(int *)&self[0x44].stopped.srcptr == 2) {
        *(undefined4 *)&self[0x44].stopped.srcptr = 1;
        goto LAB_001aa52a;
      }
      nn_sws_handler_cold_5();
      pnVar10 = extraout_RAX;
LAB_001aaa01:
      if (((char)pnVar10 == '\0') && (self[0x40].stopped.srcptr == (void *)0x0)) {
        self[0x41].stopped.fsm = (nn_fsm *)0x0;
switchD_001aa640_caseD_8:
        nn_sws_acknowledge_close_handshake((nn_sws *)self);
        return;
      }
      goto LAB_001aaa1f;
    }
    goto LAB_001aab49;
  case 6:
    if (src == 1) {
      if (type == 5) goto LAB_001aa54e;
      nn_sws_handler_cold_3();
LAB_001aa52a:
      *(undefined4 *)&self[1].fn = 7;
      iVar8 = 2;
LAB_001aa564:
      nn_fsm_raise(self,(nn_fsm_event *)&self[0x46].shutdown_fn,iVar8);
      return;
    }
LAB_001aab25:
    nn_sws_handler_cold_2();
    break;
  case 7:
    goto switchD_001aa3b8_caseD_7;
  default:
    goto switchD_001aa3b8_default;
  }
  nn_sws_handler_cold_20();
LAB_001aab31:
  nn_sws_handler_cold_24();
switchD_001aa3b8_caseD_7:
  nn_sws_handler_cold_1();
switchD_001aa3b8_default:
  nn_sws_handler_cold_25();
LAB_001aab42:
  nn_sws_handler_cold_22();
LAB_001aab49:
  nn_sws_handler_cold_6();
LAB_001aab50:
  nn_sws_handler_cold_11();
LAB_001aab55:
  nn_sws_handler_cold_12();
LAB_001aab5a:
  nn_sws_handler_cold_13();
switchD_001aa4a4_caseD_6:
  nn_sws_handler_cold_18();
LAB_001aab66:
  nn_sws_handler_cold_14();
LAB_001aab6b:
  nn_sws_handler_cold_16();
LAB_001aab70:
  nn_sws_handler_cold_15();
switchD_001aa640_caseD_3:
  nn_sws_handler_cold_8();
LAB_001aab7a:
  nn_sws_handler_cold_10();
}

Assistant:

static void nn_sws_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sws *sws;
    int rc;
    int opt;
    size_t opt_sz = sizeof (opt);

    sws = nn_cont (self, struct nn_sws, fsm);

    switch (sws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_SWS_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_ws_handshake_start (&sws->handshaker, sws->usock,
                    &sws->pipebase, sws->mode, sws->resource, sws->remote_host);
                sws->state = NN_SWS_STATE_HANDSHAKE;
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE state.                                                          */
/******************************************************************************/
    case NN_SWS_STATE_HANDSHAKE:
        switch (src) {

        case NN_SWS_SRC_HANDSHAKE:
            switch (type) {
            case NN_WS_HANDSHAKE_OK:

                /*  Before moving to the active state stop the handshake
                    state machine. */
                nn_ws_handshake_stop (&sws->handshaker);
                sws->state = NN_SWS_STATE_STOPPING_HANDSHAKE;
                return;

            case NN_WS_HANDSHAKE_ERROR:

                /* Raise the error and move directly to the DONE state.
                   ws_handshake object will be stopped later on. */
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done,
                    NN_SWS_RETURN_CLOSE_HANDSHAKE);
                return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_HANDSHAKE state.                                                 */
/******************************************************************************/
    case NN_SWS_STATE_STOPPING_HANDSHAKE:
        switch (src) {

        case NN_SWS_SRC_HANDSHAKE:
            switch (type) {
            case NN_WS_HANDSHAKE_STOPPED:

                 /*  Start the pipe. */
                 rc = nn_pipebase_start (&sws->pipebase);
                 if (nn_slow (rc < 0)) {
                    sws->state = NN_SWS_STATE_DONE;
                    nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                    return;
                 }

                 /*  Start receiving a message in asynchronous manner. */
                 nn_sws_recv_hdr (sws);

                 /*  Mark the pipe as available for sending. */
                 sws->outstate = NN_SWS_OUTSTATE_IDLE;

                 sws->state = NN_SWS_STATE_ACTIVE;
                 return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SWS_STATE_ACTIVE:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:

                /*  The message is now fully sent. */
                nn_assert (sws->outstate == NN_SWS_OUTSTATE_SENDING);
                sws->outstate = NN_SWS_OUTSTATE_IDLE;
                nn_msg_term (&sws->outmsg);
                nn_msg_init (&sws->outmsg, 0);
                nn_pipebase_sent (&sws->pipebase);
                return;

            case NN_USOCK_RECEIVED:

                switch (sws->instate) {
                case NN_SWS_INSTATE_RECV_HDR:

                    /*  Require RSV1, RSV2, and RSV3 bits to be unset for
                        x-nanomsg protocol as per RFC 6455 section 5.2. */
                    if (sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV1 ||
                        sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV2 ||
                        sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV3) {
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                            "RSV1, RSV2, and RSV3 must be unset.");
                        return;
                    }

                    sws->is_final_frame = sws->inhdr [0] &
                        NN_SWS_FRAME_BITMASK_FIN;
                    sws->masked = sws->inhdr [1] &
                        NN_SWS_FRAME_BITMASK_MASKED;

                    switch (sws->mode) {
                    case NN_WS_SERVER:
                        /*  Require mask bit to be set from client. */
                        if (sws->masked) {
                            /*  Continue receiving header for this frame. */
                            sws->ext_hdr_len = NN_SWS_FRAME_SIZE_MASK;
                            break;
                        }
                        else {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Server expects MASK bit to be set.");
                            return;
                        }
                    case NN_WS_CLIENT:
                        /*  Require mask bit to be unset from server. */
                        if (sws->masked) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Client expects MASK bit to be unset.");
                            return;
                        }
                        else {
                            /*  Continue receiving header for this frame. */
                            sws->ext_hdr_len = 0;
                            break;
                        }
                    default:
                        /*  Only two modes of this endpoint are expected. */
                        nn_assert (0);
                        return;
                    }

                    sws->opcode = sws->inhdr [0] &
                        NN_SWS_FRAME_BITMASK_OPCODE;
                    sws->payload_ctl = sws->inhdr [1] &
                        NN_SWS_FRAME_BITMASK_LENGTH;

                    /*  Prevent unexpected continuation frame. */
                    if (!sws->continuing &&
                        sws->opcode == NN_WS_OPCODE_FRAGMENT) {
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                            "No message to continue.");
                        return;
                    }

                    /*  Preserve initial message opcode and RSV bits in case
                        this is a fragmented message. */
                    if (!sws->continuing)
                        sws->inmsg_hdr = sws->inhdr [0] |
                        NN_SWS_FRAME_BITMASK_FIN;

                    if (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_0;
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_16) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_16;
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_63) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_63;
                    }
                    else {
                        /*  Developer error parsing/handling length. */
                        nn_assert (0);
                        return;
                    }

                    switch (sws->opcode) {

                    case NN_WS_OPCODE_TEXT:
                        /*  Fall thru; TEXT and BINARY handled alike. */
                    case NN_WS_OPCODE_BINARY:

                        sws->is_control_frame = 0;

                        if (sws->continuing) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Expected continuation frame opcode.");
                            return;
                        }

                        if (!sws->is_final_frame)
                            sws->continuing = 1;

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Only a remote server could send a 2-byte msg;
                                sanity-check that this endpoint is a client. */
                            nn_assert (sws->mode == NN_WS_CLIENT);

                            sws->inmsg_current_chunk_len = 0;

                            if (sws->continuing) {
                                /*  This frame was empty, but continue
                                    next frame in fragmented sequence. */
                                nn_sws_recv_hdr (sws);
                                return;
                            }
                            else {
                                /*  Special case when there is no payload,
                                    mask, or additional frames. */
                                sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                                nn_pipebase_received (&sws->pipebase);
                                return;
                            }
                            }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_FRAGMENT:

                        sws->is_control_frame = 0;
                        sws->continuing = !sws->is_final_frame;

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Only a remote server could send a 2-byte msg;
                                sanity-check that this endpoint is a client. */
                            nn_assert (sws->mode == NN_WS_CLIENT);

                            sws->inmsg_current_chunk_len = 0;

                            if (sws->continuing) {
                                /*  This frame was empty, but continue
                                    next frame in fragmented sequence. */
                                nn_sws_recv_hdr (sws);
                                return;
                            }
                            else {
                                /*  Special case when there is no payload,
                                    mask, or additional frames. */
                                sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                                nn_pipebase_received (&sws->pipebase);
                                return;
                            }
                        }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_PING:
                        sws->is_control_frame = 1;
                        sws->pings_received++;
                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_PONG:
                        sws->is_control_frame = 1;
                        sws->pongs_received++;
                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_CLOSE:
                        /*  RFC 6455 section 5.5.1. */
                        sws->is_control_frame = 1;
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }

                        if (sws->payload_ctl == 1) {
                            /*  As per RFC 6455 section 5.5.1, if a payload is
                                to accompany a close frame, the first two bytes
                                MUST be the close code. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Expected 2byte close code.");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            nn_sws_acknowledge_close_handshake (sws);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;

                    default:
                        /*  Client sent an invalid opcode; as per RFC 6455
                            section 10.7, close connection with code. */
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Invalid opcode.");
                        return;

                    }

                    if (sws->ext_hdr_len == 0) {
                        /*  Only a remote server could send a 2-byte msg;
                            sanity-check that this endpoint is a client. */
                        nn_assert (sws->mode == NN_WS_CLIENT);

                        /*  In the case of no additional header, the payload
                            is known to be within these bounds. */
                        nn_assert (0 < sws->payload_ctl &&
                            sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH);

                        sws->inmsg_current_chunk_len = sws->payload_ctl;

                        /*  Use scatter/gather array for application messages,
                            and a fixed-width buffer for control messages. This
                            is convenient since control messages can be
                            interspersed between chunked application msgs. */
                        if (sws->is_control_frame) {
                            sws->inmsg_current_chunk_buf = sws->inmsg_control;
                        }
                        else {
                            sws->inmsg_total_size += sws->inmsg_current_chunk_len;
                            /*  Protect non-control messages against the
                                NN_RCVMAXSIZE threshold; control messages already
                                have a small pre-allocated buffer, and therefore
                                are not subject to this limit. */
                            nn_pipebase_getopt (&sws->pipebase, NN_SOL_SOCKET,
                                NN_RCVMAXSIZE, &opt, &opt_sz);
                            if (opt >= 0 && sws->inmsg_total_size > (size_t) opt) {
                                nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_TOOBIG,
                                    "Message larger than application allows.");
                                return;
                            }
                            sws->inmsg_chunks++;
                            sws->inmsg_current_chunk_buf =
                                nn_msg_chunk_new (sws->inmsg_current_chunk_len,
                                &sws->inmsg_array);
                        }

                        sws->instate = NN_SWS_INSTATE_RECV_PAYLOAD;
                        nn_usock_recv (sws->usock, sws->inmsg_current_chunk_buf,
                            sws->inmsg_current_chunk_len, NULL);
                        return;
                    }
                    else {
                        /*  Continue receiving the rest of the header frame. */
                        sws->instate = NN_SWS_INSTATE_RECV_HDREXT;
                        nn_usock_recv (sws->usock,
                            sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL,
                            sws->ext_hdr_len,
                            NULL);
                        return;
                    }

                case NN_SWS_INSTATE_RECV_HDREXT:
                    nn_assert (sws->ext_hdr_len > 0);

                    if (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH) {
                        sws->inmsg_current_chunk_len = sws->payload_ctl;
                        if (sws->masked) {
                            sws->mask = sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_16) {
                        sws->inmsg_current_chunk_len =
                            nn_gets (sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL);
                        if (sws->masked) {
                            sws->mask = sws->inhdr +
                                NN_SWS_FRAME_SIZE_INITIAL +
                                NN_SWS_FRAME_SIZE_PAYLOAD_16;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_63) {
                        sws->inmsg_current_chunk_len =
                            (size_t) nn_getll (sws->inhdr +
                            NN_SWS_FRAME_SIZE_INITIAL);
                        if (sws->masked) {
                            sws->mask = sws->inhdr +
                                NN_SWS_FRAME_SIZE_INITIAL +
                                NN_SWS_FRAME_SIZE_PAYLOAD_63;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else {
                        /*  Client sent invalid data; as per RFC 6455,
                            server closes the connection immediately. */
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Invalid payload length.");
                        return;
                    }

                    /*  Handle zero-length message bodies. */
                    if (sws->inmsg_current_chunk_len == 0) {
                        if (sws->is_final_frame) {
                            if (sws->opcode == NN_WS_OPCODE_CLOSE) {
                                nn_sws_acknowledge_close_handshake (sws);
                            }
                            else {
                                sws->instate = (sws->is_control_frame ?
                                    NN_SWS_INSTATE_RECVD_CONTROL :
                                    NN_SWS_INSTATE_RECVD_CHUNKED);
                                nn_pipebase_received (&sws->pipebase);
                            }
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;
                    }

                    nn_assert (sws->inmsg_current_chunk_len > 0);

                    /*  Use scatter/gather array for application messages,
                        and a fixed-width buffer for control messages. This
                        is convenient since control messages can be
                        interspersed between chunked application msgs. */
                    if (sws->is_control_frame) {
                        sws->inmsg_current_chunk_buf = sws->inmsg_control;
                    }
                    else {
                        sws->inmsg_total_size += sws->inmsg_current_chunk_len;
                        /*  Protect non-control messages against the
                            NN_RCVMAXSIZE threshold; control messages already
                            have a small pre-allocated buffer, and therefore
                            are not subject to this limit. */
                        nn_pipebase_getopt (&sws->pipebase, NN_SOL_SOCKET,
                            NN_RCVMAXSIZE, &opt, &opt_sz);
                        if (opt >= 0 && sws->inmsg_total_size > (size_t) opt) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_TOOBIG,
                                "Message size exceeds limit.");
                            return;
                        }
                        sws->inmsg_chunks++;
                        sws->inmsg_current_chunk_buf =
                            nn_msg_chunk_new (sws->inmsg_current_chunk_len,
                            &sws->inmsg_array);
                    }

                    sws->instate = NN_SWS_INSTATE_RECV_PAYLOAD;
                    nn_usock_recv (sws->usock, sws->inmsg_current_chunk_buf,
                        sws->inmsg_current_chunk_len, NULL);
                    return;

                case NN_SWS_INSTATE_RECV_PAYLOAD:

                    /*  Unmask if necessary. */
                    if (sws->masked) {
                        nn_sws_mask_payload (sws->inmsg_current_chunk_buf,
                            sws->inmsg_current_chunk_len, sws->mask,
                            NN_SWS_FRAME_SIZE_MASK, NULL);
                    }

                    switch (sws->opcode) {

                    case NN_WS_OPCODE_TEXT:
                        nn_sws_validate_utf8_chunk (sws);
                        return;

                    case NN_WS_OPCODE_BINARY:
                        if (sws->is_final_frame) {
                            sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                            nn_pipebase_received (&sws->pipebase);
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;

                    case NN_WS_OPCODE_FRAGMENT:
                        /*  Must check original opcode to see if this fragment
                            needs UTF-8 validation. */
                        if ((sws->inmsg_hdr & NN_SWS_FRAME_BITMASK_OPCODE) ==
                            NN_WS_OPCODE_TEXT) {
                            nn_sws_validate_utf8_chunk (sws);
                        }
                        else if (sws->is_final_frame) {
                            sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                            nn_pipebase_received (&sws->pipebase);
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;

                    case NN_WS_OPCODE_PING:
                        sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                        nn_pipebase_received (&sws->pipebase);
                        return;

                    case NN_WS_OPCODE_PONG:
                        sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                        nn_pipebase_received (&sws->pipebase);
                        return;

                    case NN_WS_OPCODE_CLOSE:
                        nn_sws_acknowledge_close_handshake (sws);
                        return;

                    default:
                        /*  This should have been prevented upstream. */
                        nn_assert (0);
                        return;
                    }

                default:
                    nn_fsm_error ("Unexpected socket instate",
                        sws->state, src, type);
                }

            case NN_USOCK_SHUTDOWN:
                nn_pipebase_stop (&sws->pipebase);
                sws->state = NN_SWS_STATE_BROKEN_CONNECTION;
                return;

            case NN_USOCK_ERROR:
                nn_pipebase_stop (&sws->pipebase);
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

            break;

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  CLOSING_CONNECTION state.                                                 */
/*  Wait for acknowledgement closing handshake was successfully sent.         */
/******************************************************************************/
    case NN_SWS_STATE_CLOSING_CONNECTION:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  Wait for acknowledgement closing handshake was sent
                    to peer. */
                nn_assert (sws->outstate == NN_SWS_OUTSTATE_SENDING);
                sws->outstate = NN_SWS_OUTSTATE_IDLE;
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done,
                    NN_SWS_RETURN_CLOSE_HANDSHAKE);
                return;
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_ERROR:
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  SHUTTING_DOWN state.                                                      */
/*  The underlying connection is closed. We are just waiting that underlying  */
/*  usock being closed                                                        */
/******************************************************************************/
    case NN_SWS_STATE_BROKEN_CONNECTION:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ERROR:
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The underlying connection is closed. There's nothing that can be done in  */
/*  this state except stopping the object.                                    */
/******************************************************************************/
    case NN_SWS_STATE_DONE:
        nn_fsm_bad_source (sws->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sws->state, src, type);
    }
}